

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::SubGridIntersectorKMoeller<4,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  ushort uVar3;
  ushort uVar4;
  RTCFilterFunctionN p_Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined4 uVar33;
  undefined4 uVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  Geometry *pGVar44;
  ulong *puVar45;
  byte bVar46;
  int iVar47;
  undefined4 uVar48;
  ulong uVar49;
  uint uVar50;
  undefined4 uVar51;
  ulong uVar52;
  long lVar53;
  ulong uVar54;
  long lVar55;
  ulong uVar56;
  uint uVar57;
  uint uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  long lVar63;
  ulong uVar64;
  long lVar65;
  float fVar66;
  float fVar72;
  float fVar73;
  vint4 ai_1;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  vint4 ai;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  float fVar87;
  float fVar101;
  float fVar102;
  vint4 ai_3;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar103;
  undefined1 auVar95 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar107;
  float fVar114;
  float fVar115;
  vint4 ai_2;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  float fVar131;
  float fVar135;
  float fVar136;
  undefined1 auVar132 [16];
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar141 [32];
  float fVar142;
  undefined1 auVar143 [32];
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar144 [64];
  float fVar151;
  uint uVar152;
  uint uVar157;
  uint uVar159;
  float fVar160;
  uint uVar161;
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  float fVar156;
  float fVar158;
  float fVar162;
  uint uVar163;
  float fVar164;
  uint uVar165;
  float fVar166;
  uint uVar167;
  uint uVar168;
  undefined1 auVar155 [64];
  float fVar169;
  float fVar170;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar171 [32];
  float fVar178;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar179 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  float fVar190;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar191 [32];
  float old_t;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong *local_ca0;
  undefined1 local_c50 [16];
  undefined1 (*local_c40) [16];
  ulong *local_c38;
  ulong local_c30;
  ulong local_c28;
  ulong local_c20;
  ulong local_c18;
  ulong local_c10;
  ulong local_c08;
  long local_c00;
  long local_bf8;
  ulong local_bf0;
  ulong local_be8;
  long local_be0;
  ulong local_bd8;
  ulong local_bd0;
  ulong local_bc8;
  ulong local_bc0;
  ulong local_bb8;
  ulong local_bb0;
  long local_ba8;
  float local_ba0;
  float fStack_b9c;
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  RTCFilterFunctionNArguments local_b70;
  undefined1 local_b40 [16];
  undefined1 auStack_b30 [16];
  undefined1 local_b20 [16];
  undefined1 auStack_b10 [16];
  Geometry *local_b00;
  undefined1 auStack_af8 [24];
  undefined1 local_ad0 [16];
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float local_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined1 local_a80 [32];
  float local_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [16];
  float local_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  undefined1 local_a10 [16];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined1 local_9f0 [16];
  uint local_9e0;
  uint uStack_9dc;
  uint uStack_9d8;
  uint uStack_9d4;
  uint uStack_9d0;
  uint uStack_9cc;
  uint uStack_9c8;
  uint uStack_9c4;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  float local_8a0 [4];
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  float local_880 [4];
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  uint uStack_864;
  float local_860 [4];
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined4 uStack_844;
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  float local_820 [4];
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined4 uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  uVar48 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_ad0._4_4_ = uVar48;
  local_ad0._0_4_ = uVar48;
  local_ad0._8_4_ = uVar48;
  local_ad0._12_4_ = uVar48;
  auVar130 = ZEXT1664(local_ad0);
  uVar48 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_a90._4_4_ = uVar48;
  local_a90._0_4_ = uVar48;
  local_a90._8_4_ = uVar48;
  local_a90._12_4_ = uVar48;
  auVar144 = ZEXT1664(local_a90);
  uVar48 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_aa0._4_4_ = uVar48;
  local_aa0._0_4_ = uVar48;
  local_aa0._8_4_ = uVar48;
  local_aa0._12_4_ = uVar48;
  auVar155 = ZEXT1664(local_aa0);
  fVar169 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar73 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar56 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar59 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar60 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar61 = uVar56 ^ 0x10;
  uVar62 = uVar59 ^ 0x10;
  uVar54 = uVar60 ^ 0x10;
  iVar47 = (tray->tnear).field_0.i[k];
  auVar186._4_4_ = iVar47;
  auVar186._0_4_ = iVar47;
  auVar186._8_4_ = iVar47;
  auVar186._12_4_ = iVar47;
  iVar47 = (tray->tfar).field_0.i[k];
  auVar188._4_4_ = iVar47;
  auVar188._0_4_ = iVar47;
  auVar188._8_4_ = iVar47;
  auVar188._12_4_ = iVar47;
  local_c08 = uVar56 >> 2;
  local_c10 = uVar61 >> 2;
  local_9a0._16_16_ = mm_lookupmask_ps._240_16_;
  local_9a0._0_16_ = mm_lookupmask_ps._0_16_;
  local_c40 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_c18 = uVar59 >> 2;
  local_c20 = uVar62 >> 2;
  local_c28 = uVar60 >> 2;
  local_c30 = uVar54 >> 2;
  auVar70._8_4_ = 0xbf800000;
  auVar70._0_8_ = 0xbf800000bf800000;
  auVar70._12_4_ = 0xbf800000;
  auVar70._16_4_ = 0xbf800000;
  auVar70._20_4_ = 0xbf800000;
  auVar70._24_4_ = 0xbf800000;
  auVar70._28_4_ = 0xbf800000;
  auVar96._8_4_ = 0x3f800000;
  auVar96._0_8_ = 0x3f8000003f800000;
  auVar96._12_4_ = 0x3f800000;
  auVar96._16_4_ = 0x3f800000;
  auVar96._20_4_ = 0x3f800000;
  auVar96._24_4_ = 0x3f800000;
  auVar96._28_4_ = 0x3f800000;
  _local_9c0 = vblendvps_avx(auVar96,auVar70,local_9a0);
  puVar45 = local_7f8;
  fVar74 = fVar169;
  fVar75 = fVar169;
  fVar77 = fVar169;
  fVar79 = fVar73;
  fVar76 = fVar73;
  fVar78 = fVar73;
  local_bd8 = uVar54;
  local_bd0 = uVar62;
  local_bc8 = uVar61;
  local_bc0 = uVar60;
  local_bb8 = uVar59;
  local_bb0 = uVar56;
  local_ac0 = fVar73;
  fStack_abc = fVar73;
  fStack_ab8 = fVar73;
  fStack_ab4 = fVar73;
  local_ab0 = fVar169;
  fStack_aac = fVar169;
  fStack_aa8 = fVar169;
  fStack_aa4 = fVar169;
LAB_00f2148d:
  do {
    local_c38 = puVar45;
    if (local_c38 == &local_800) {
LAB_00f2203a:
      return local_c38 != &local_800;
    }
    local_ca0 = local_c38 + -1;
    uVar64 = local_c38[-1];
    while ((uVar64 & 8) == 0) {
      auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + uVar56),auVar130._0_16_);
      auVar93._0_4_ = fVar169 * auVar67._0_4_;
      auVar93._4_4_ = fVar74 * auVar67._4_4_;
      auVar93._8_4_ = fVar75 * auVar67._8_4_;
      auVar93._12_4_ = fVar77 * auVar67._12_4_;
      auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + uVar59),auVar144._0_16_);
      auVar94._0_4_ = fVar73 * auVar67._0_4_;
      auVar94._4_4_ = fVar79 * auVar67._4_4_;
      auVar94._8_4_ = fVar76 * auVar67._8_4_;
      auVar94._12_4_ = fVar78 * auVar67._12_4_;
      auVar67 = vpmaxsd_avx(auVar93,auVar94);
      auVar93 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + uVar60),auVar155._0_16_);
      auVar80._0_4_ = fVar1 * auVar93._0_4_;
      auVar80._4_4_ = fVar1 * auVar93._4_4_;
      auVar80._8_4_ = fVar1 * auVar93._8_4_;
      auVar80._12_4_ = fVar1 * auVar93._12_4_;
      auVar93 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + uVar61),auVar130._0_16_);
      auVar88._0_4_ = fVar169 * auVar93._0_4_;
      auVar88._4_4_ = fVar74 * auVar93._4_4_;
      auVar88._8_4_ = fVar75 * auVar93._8_4_;
      auVar88._12_4_ = fVar77 * auVar93._12_4_;
      auVar93 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + uVar62),auVar144._0_16_);
      auVar108._0_4_ = fVar73 * auVar93._0_4_;
      auVar108._4_4_ = fVar79 * auVar93._4_4_;
      auVar108._8_4_ = fVar76 * auVar93._8_4_;
      auVar108._12_4_ = fVar78 * auVar93._12_4_;
      auVar94 = vpminsd_avx(auVar88,auVar108);
      auVar93 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + uVar54),auVar155._0_16_);
      auVar109._0_4_ = fVar1 * auVar93._0_4_;
      auVar109._4_4_ = fVar1 * auVar93._4_4_;
      auVar109._8_4_ = fVar1 * auVar93._8_4_;
      auVar109._12_4_ = fVar1 * auVar93._12_4_;
      auVar93 = vpmaxsd_avx(auVar80,auVar186);
      auVar67 = vpmaxsd_avx(auVar67,auVar93);
      auVar93 = vpminsd_avx(auVar109,auVar188);
      auVar93 = vpminsd_avx(auVar94,auVar93);
      auVar67 = vpcmpgtd_avx(auVar67,auVar93);
      iVar47 = vmovmskps_avx(auVar67);
      puVar45 = local_ca0;
      if (iVar47 == 0xf) goto LAB_00f2148d;
      bVar46 = (byte)iVar47 ^ 0xf;
      uVar49 = uVar64 & 0xfffffffffffffff0;
      lVar53 = 0;
      if (bVar46 != 0) {
        for (; (bVar46 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
        }
      }
      uVar64 = *(ulong *)(uVar49 + lVar53 * 8);
      uVar50 = bVar46 - 1 & (uint)bVar46;
      uVar52 = (ulong)uVar50;
      if (uVar50 != 0) {
        do {
          *local_ca0 = uVar64;
          local_ca0 = local_ca0 + 1;
          lVar53 = 0;
          if (uVar52 != 0) {
            for (; (uVar52 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
            }
          }
          uVar64 = *(ulong *)(uVar49 + lVar53 * 8);
          uVar52 = uVar52 - 1 & uVar52;
        } while (uVar52 != 0);
      }
    }
    local_c00 = (ulong)((uint)uVar64 & 0xf) - 8;
    uVar64 = uVar64 & 0xfffffffffffffff0;
    for (local_bf8 = 0; puVar45 = local_ca0, local_bf8 != local_c00; local_bf8 = local_bf8 + 1) {
      lVar53 = local_bf8 * 0x58;
      local_ba8 = lVar53 + uVar64;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = *(ulong *)(uVar64 + 0x20 + lVar53);
      auVar81._8_8_ = 0;
      auVar81._0_8_ = *(ulong *)(uVar64 + 0x24 + lVar53);
      auVar93 = vpminub_avx(auVar67,auVar81);
      auVar67 = vpcmpeqb_avx(auVar67,auVar93);
      auVar93 = vpcmpeqd_avx(auVar93,auVar93);
      auVar67 = vpmovzxbd_avx(auVar67 ^ auVar93);
      auVar67 = vpslld_avx(auVar67 ^ auVar93,0x1f);
      uVar48 = vmovmskps_avx(auVar67);
      fVar87 = *(float *)(uVar64 + 0x38 + lVar53);
      fVar101 = *(float *)(uVar64 + 0x44 + lVar53);
      auVar89._8_8_ = 0;
      auVar89._0_8_ = *(ulong *)(local_c08 + 0x20 + local_ba8);
      auVar67 = vpmovzxbd_avx(auVar89);
      auVar67 = vcvtdq2ps_avx(auVar67);
      auVar90._0_4_ = fVar87 + fVar101 * auVar67._0_4_;
      auVar90._4_4_ = fVar87 + fVar101 * auVar67._4_4_;
      auVar90._8_4_ = fVar87 + fVar101 * auVar67._8_4_;
      auVar90._12_4_ = fVar87 + fVar101 * auVar67._12_4_;
      auVar110._8_8_ = 0;
      auVar110._0_8_ = *(ulong *)(local_c10 + 0x20 + local_ba8);
      auVar67 = vpmovzxbd_avx(auVar110);
      auVar67 = vcvtdq2ps_avx(auVar67);
      auVar68._0_4_ = fVar87 + fVar101 * auVar67._0_4_;
      auVar68._4_4_ = fVar87 + fVar101 * auVar67._4_4_;
      auVar68._8_4_ = fVar87 + fVar101 * auVar67._8_4_;
      auVar68._12_4_ = fVar87 + fVar101 * auVar67._12_4_;
      fVar87 = *(float *)(uVar64 + 0x3c + lVar53);
      fVar101 = *(float *)(uVar64 + 0x48 + lVar53);
      auVar120._8_8_ = 0;
      auVar120._0_8_ = *(ulong *)(local_c18 + 0x20 + local_ba8);
      auVar67 = vpmovzxbd_avx(auVar120);
      auVar67 = vcvtdq2ps_avx(auVar67);
      auVar121._0_4_ = fVar87 + fVar101 * auVar67._0_4_;
      auVar121._4_4_ = fVar87 + fVar101 * auVar67._4_4_;
      auVar121._8_4_ = fVar87 + fVar101 * auVar67._8_4_;
      auVar121._12_4_ = fVar87 + fVar101 * auVar67._12_4_;
      auVar124._8_8_ = 0;
      auVar124._0_8_ = *(ulong *)(local_c20 + 0x20 + local_ba8);
      auVar67 = vpmovzxbd_avx(auVar124);
      auVar67 = vcvtdq2ps_avx(auVar67);
      auVar82._0_4_ = fVar87 + fVar101 * auVar67._0_4_;
      auVar82._4_4_ = fVar87 + fVar101 * auVar67._4_4_;
      auVar82._8_4_ = fVar87 + fVar101 * auVar67._8_4_;
      auVar82._12_4_ = fVar87 + fVar101 * auVar67._12_4_;
      fVar87 = *(float *)(uVar64 + 0x4c + lVar53);
      auVar125._8_8_ = 0;
      auVar125._0_8_ = *(ulong *)(local_c28 + 0x20 + local_ba8);
      auVar67 = vpmovzxbd_avx(auVar125);
      auVar67 = vcvtdq2ps_avx(auVar67);
      auVar132._8_8_ = 0;
      auVar132._0_8_ = *(ulong *)(local_c30 + 0x20 + local_ba8);
      auVar93 = vpmovzxbd_avx(auVar132);
      auVar93 = vcvtdq2ps_avx(auVar93);
      fVar101 = *(float *)(uVar64 + 0x40 + lVar53);
      auVar126._0_4_ = fVar101 + fVar87 * auVar67._0_4_;
      auVar126._4_4_ = fVar101 + fVar87 * auVar67._4_4_;
      auVar126._8_4_ = fVar101 + fVar87 * auVar67._8_4_;
      auVar126._12_4_ = fVar101 + fVar87 * auVar67._12_4_;
      auVar111._0_4_ = fVar101 + fVar87 * auVar93._0_4_;
      auVar111._4_4_ = fVar101 + fVar87 * auVar93._4_4_;
      auVar111._8_4_ = fVar101 + fVar87 * auVar93._8_4_;
      auVar111._12_4_ = fVar101 + fVar87 * auVar93._12_4_;
      auVar67 = vsubps_avx(auVar90,auVar130._0_16_);
      auVar91._0_4_ = fVar169 * auVar67._0_4_;
      auVar91._4_4_ = fVar74 * auVar67._4_4_;
      auVar91._8_4_ = fVar75 * auVar67._8_4_;
      auVar91._12_4_ = fVar77 * auVar67._12_4_;
      auVar67 = vsubps_avx(auVar121,auVar144._0_16_);
      auVar122._0_4_ = fVar73 * auVar67._0_4_;
      auVar122._4_4_ = fVar79 * auVar67._4_4_;
      auVar122._8_4_ = fVar76 * auVar67._8_4_;
      auVar122._12_4_ = fVar78 * auVar67._12_4_;
      auVar67 = vpmaxsd_avx(auVar91,auVar122);
      auVar93 = vsubps_avx(auVar68,auVar130._0_16_);
      auVar69._0_4_ = fVar169 * auVar93._0_4_;
      auVar69._4_4_ = fVar74 * auVar93._4_4_;
      auVar69._8_4_ = fVar75 * auVar93._8_4_;
      auVar69._12_4_ = fVar77 * auVar93._12_4_;
      auVar93 = vsubps_avx(auVar82,auVar144._0_16_);
      auVar83._0_4_ = fVar73 * auVar93._0_4_;
      auVar83._4_4_ = fVar79 * auVar93._4_4_;
      auVar83._8_4_ = fVar76 * auVar93._8_4_;
      auVar83._12_4_ = fVar78 * auVar93._12_4_;
      auVar94 = vpminsd_avx(auVar69,auVar83);
      auVar93 = vsubps_avx(auVar126,auVar155._0_16_);
      auVar84._0_4_ = fVar1 * auVar93._0_4_;
      auVar84._4_4_ = fVar1 * auVar93._4_4_;
      auVar84._8_4_ = fVar1 * auVar93._8_4_;
      auVar84._12_4_ = fVar1 * auVar93._12_4_;
      auVar93 = vpmaxsd_avx(auVar84,auVar186);
      auVar67 = vpmaxsd_avx(auVar67,auVar93);
      auVar93 = vsubps_avx(auVar111,auVar155._0_16_);
      auVar92._0_4_ = fVar1 * auVar93._0_4_;
      auVar92._4_4_ = fVar1 * auVar93._4_4_;
      auVar92._8_4_ = fVar1 * auVar93._8_4_;
      auVar92._12_4_ = fVar1 * auVar93._12_4_;
      auVar93 = vpminsd_avx(auVar92,auVar188);
      auVar93 = vpminsd_avx(auVar94,auVar93);
      auVar67 = vpcmpgtd_avx(auVar67,auVar93);
      uVar51 = vmovmskps_avx(auVar67);
      for (uVar49 = (ulong)(byte)(~(byte)uVar51 & (byte)uVar48); uVar49 != 0;
          uVar49 = uVar49 & uVar49 - 1) {
        lVar53 = 0;
        if (uVar49 != 0) {
          for (; (uVar49 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
          }
        }
        uVar3 = *(ushort *)(local_ba8 + lVar53 * 8);
        uVar4 = *(ushort *)(local_ba8 + 2 + lVar53 * 8);
        local_be8 = (ulong)*(uint *)(local_ba8 + 0x50);
        uVar50 = *(uint *)(local_ba8 + 4 + lVar53 * 8);
        local_bf0 = (ulong)uVar50;
        local_b00 = (context->scene->geometries).items[local_be8].ptr;
        local_be0 = *(long *)&local_b00->field_0x58;
        lVar55 = local_b00[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                 local_bf0;
        uVar57 = uVar3 & 0x7fff;
        uVar58 = uVar4 & 0x7fff;
        uVar152 = *(uint *)(local_be0 + 4 + lVar55);
        uVar59 = (ulong)uVar152;
        uVar56 = (ulong)(uVar152 * uVar58 + *(int *)(local_be0 + lVar55) + uVar57);
        p_Var5 = local_b00[1].intersectionFilterN;
        lVar53 = *(long *)&local_b00[1].time_range.upper;
        auVar67 = *(undefined1 (*) [16])(lVar53 + (long)p_Var5 * uVar56);
        auVar93 = *(undefined1 (*) [16])(lVar53 + (uVar56 + 1) * (long)p_Var5);
        auVar94 = *(undefined1 (*) [16])(lVar53 + (uVar56 + uVar59) * (long)p_Var5);
        lVar65 = uVar56 + uVar59 + 1;
        auVar80 = *(undefined1 (*) [16])(lVar53 + lVar65 * (long)p_Var5);
        uVar54 = (ulong)(-1 < (short)uVar3);
        auVar88 = *(undefined1 (*) [16])(lVar53 + (uVar56 + uVar54 + 1) * (long)p_Var5);
        lVar63 = uVar54 + lVar65;
        auVar108 = *(undefined1 (*) [16])(lVar53 + lVar63 * (long)p_Var5);
        uVar54 = 0;
        if (-1 < (short)uVar4) {
          uVar54 = uVar59;
        }
        auVar109 = *(undefined1 (*) [16])(lVar53 + (uVar56 + uVar59 + uVar54) * (long)p_Var5);
        auVar68 = *(undefined1 (*) [16])(lVar53 + (lVar65 + uVar54) * (long)p_Var5);
        auVar69 = *(undefined1 (*) [16])(lVar53 + (uVar54 + lVar63) * (long)p_Var5);
        auVar82 = vunpcklps_avx(auVar67,auVar80);
        auVar67 = vunpckhps_avx(auVar67,auVar80);
        auVar83 = vunpcklps_avx(auVar93,auVar94);
        auVar81 = vunpckhps_avx(auVar93,auVar94);
        auVar81 = vunpcklps_avx(auVar67,auVar81);
        auVar84 = vunpcklps_avx(auVar82,auVar83);
        auVar67 = vunpckhps_avx(auVar82,auVar83);
        auVar82 = vunpcklps_avx(auVar93,auVar108);
        auVar93 = vunpckhps_avx(auVar93,auVar108);
        auVar83 = vunpcklps_avx(auVar88,auVar80);
        auVar88 = vunpckhps_avx(auVar88,auVar80);
        auVar89 = vunpcklps_avx(auVar93,auVar88);
        auVar90 = vunpcklps_avx(auVar82,auVar83);
        auVar93 = vunpckhps_avx(auVar82,auVar83);
        auVar82 = vunpcklps_avx(auVar80,auVar69);
        auVar88 = vunpckhps_avx(auVar80,auVar69);
        auVar69 = vunpcklps_avx(auVar108,auVar68);
        auVar108 = vunpckhps_avx(auVar108,auVar68);
        auVar108 = vunpcklps_avx(auVar88,auVar108);
        auVar83 = vunpcklps_avx(auVar82,auVar69);
        auVar88 = vunpckhps_avx(auVar82,auVar69);
        auVar69 = vunpcklps_avx(auVar94,auVar68);
        auVar94 = vunpckhps_avx(auVar94,auVar68);
        auVar68 = vunpcklps_avx(auVar80,auVar109);
        auVar80 = vunpckhps_avx(auVar80,auVar109);
        auVar80 = vunpcklps_avx(auVar94,auVar80);
        auVar109 = vunpcklps_avx(auVar69,auVar68);
        auVar94 = vunpckhps_avx(auVar69,auVar68);
        auVar86._16_16_ = auVar83;
        auVar86._0_16_ = auVar84;
        auVar123._16_16_ = auVar88;
        auVar123._0_16_ = auVar67;
        auVar143._16_16_ = auVar108;
        auVar143._0_16_ = auVar81;
        auVar112._16_16_ = auVar90;
        auVar112._0_16_ = auVar90;
        auVar128._16_16_ = auVar93;
        auVar128._0_16_ = auVar93;
        auVar97._16_16_ = auVar89;
        auVar97._0_16_ = auVar89;
        auVar154._16_16_ = auVar109;
        auVar154._0_16_ = auVar109;
        auVar171._16_16_ = auVar94;
        auVar171._0_16_ = auVar94;
        auVar179._16_16_ = auVar80;
        auVar179._0_16_ = auVar80;
        auVar112 = vsubps_avx(auVar86,auVar112);
        auVar128 = vsubps_avx(auVar123,auVar128);
        auVar70 = vsubps_avx(auVar143,auVar97);
        auVar96 = vsubps_avx(auVar154,auVar86);
        auVar71 = vsubps_avx(auVar171,auVar123);
        auVar97 = vsubps_avx(auVar179,auVar143);
        fVar75 = auVar128._0_4_;
        fVar178 = auVar97._0_4_;
        fVar101 = auVar128._4_4_;
        fVar180 = auVar97._4_4_;
        auVar27._4_4_ = fVar180 * fVar101;
        auVar27._0_4_ = fVar178 * fVar75;
        fVar107 = auVar128._8_4_;
        fVar181 = auVar97._8_4_;
        auVar27._8_4_ = fVar181 * fVar107;
        fVar119 = auVar128._12_4_;
        fVar182 = auVar97._12_4_;
        auVar27._12_4_ = fVar182 * fVar119;
        fVar9 = auVar128._16_4_;
        fVar183 = auVar97._16_4_;
        auVar27._16_4_ = fVar183 * fVar9;
        fVar15 = auVar128._20_4_;
        fVar184 = auVar97._20_4_;
        auVar27._20_4_ = fVar184 * fVar15;
        fVar21 = auVar128._24_4_;
        fVar185 = auVar97._24_4_;
        auVar27._24_4_ = fVar185 * fVar21;
        auVar27._28_4_ = auVar89._12_4_;
        fVar77 = auVar70._0_4_;
        fVar170 = auVar71._0_4_;
        fVar102 = auVar70._4_4_;
        fVar172 = auVar71._4_4_;
        auVar28._4_4_ = fVar172 * fVar102;
        auVar28._0_4_ = fVar170 * fVar77;
        fVar114 = auVar70._8_4_;
        fVar173 = auVar71._8_4_;
        auVar28._8_4_ = fVar173 * fVar114;
        fVar66 = auVar70._12_4_;
        fVar174 = auVar71._12_4_;
        auVar28._12_4_ = fVar174 * fVar66;
        fVar10 = auVar70._16_4_;
        fVar175 = auVar71._16_4_;
        auVar28._16_4_ = fVar175 * fVar10;
        fVar16 = auVar70._20_4_;
        fVar176 = auVar71._20_4_;
        auVar28._20_4_ = fVar176 * fVar16;
        fVar22 = auVar70._24_4_;
        uVar33 = auVar90._12_4_;
        fVar177 = auVar71._24_4_;
        auVar28._24_4_ = fVar177 * fVar22;
        auVar28._28_4_ = uVar33;
        auVar27 = vsubps_avx(auVar28,auVar27);
        fVar151 = auVar96._0_4_;
        fVar156 = auVar96._4_4_;
        auVar29._4_4_ = fVar156 * fVar102;
        auVar29._0_4_ = fVar151 * fVar77;
        fVar158 = auVar96._8_4_;
        auVar29._8_4_ = fVar158 * fVar114;
        fVar160 = auVar96._12_4_;
        auVar29._12_4_ = fVar160 * fVar66;
        fVar162 = auVar96._16_4_;
        auVar29._16_4_ = fVar162 * fVar10;
        fVar164 = auVar96._20_4_;
        auVar29._20_4_ = fVar164 * fVar16;
        fVar166 = auVar96._24_4_;
        auVar29._24_4_ = fVar166 * fVar22;
        auVar29._28_4_ = uVar33;
        fVar79 = auVar112._0_4_;
        fVar103 = auVar112._4_4_;
        auVar30._4_4_ = fVar180 * fVar103;
        auVar30._0_4_ = fVar178 * fVar79;
        fVar115 = auVar112._8_4_;
        auVar30._8_4_ = fVar181 * fVar115;
        fVar72 = auVar112._12_4_;
        auVar30._12_4_ = fVar182 * fVar72;
        fVar11 = auVar112._16_4_;
        auVar30._16_4_ = fVar183 * fVar11;
        fVar17 = auVar112._20_4_;
        auVar30._20_4_ = fVar184 * fVar17;
        fVar23 = auVar112._24_4_;
        uVar34 = auVar93._12_4_;
        auVar30._24_4_ = fVar185 * fVar23;
        auVar30._28_4_ = uVar34;
        auVar70 = vsubps_avx(auVar30,auVar29);
        auVar31._4_4_ = fVar172 * fVar103;
        auVar31._0_4_ = fVar170 * fVar79;
        auVar31._8_4_ = fVar173 * fVar115;
        auVar31._12_4_ = fVar174 * fVar72;
        auVar31._16_4_ = fVar175 * fVar11;
        auVar31._20_4_ = fVar176 * fVar17;
        auVar31._24_4_ = fVar177 * fVar23;
        auVar31._28_4_ = uVar34;
        auVar32._4_4_ = fVar156 * fVar101;
        auVar32._0_4_ = fVar151 * fVar75;
        auVar32._8_4_ = fVar158 * fVar107;
        auVar32._12_4_ = fVar160 * fVar119;
        auVar32._16_4_ = fVar162 * fVar9;
        auVar32._20_4_ = fVar164 * fVar15;
        auVar32._24_4_ = fVar166 * fVar21;
        auVar32._28_4_ = auVar128._28_4_;
        uVar48 = *(undefined4 *)(ray + k * 4);
        auVar187._4_4_ = uVar48;
        auVar187._0_4_ = uVar48;
        auVar187._8_4_ = uVar48;
        auVar187._12_4_ = uVar48;
        auVar187._16_4_ = uVar48;
        auVar187._20_4_ = uVar48;
        auVar187._24_4_ = uVar48;
        auVar187._28_4_ = uVar48;
        uVar51 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar189._4_4_ = uVar51;
        auVar189._0_4_ = uVar51;
        auVar189._8_4_ = uVar51;
        auVar189._12_4_ = uVar51;
        auVar189._16_4_ = uVar51;
        auVar189._20_4_ = uVar51;
        auVar189._24_4_ = uVar51;
        auVar189._28_4_ = uVar51;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar191._4_4_ = uVar2;
        auVar191._0_4_ = uVar2;
        auVar191._8_4_ = uVar2;
        auVar191._12_4_ = uVar2;
        auVar191._16_4_ = uVar2;
        auVar191._20_4_ = uVar2;
        auVar191._24_4_ = uVar2;
        auVar191._28_4_ = uVar2;
        fVar169 = *(float *)(ray + k * 4 + 0x50);
        local_a80 = vsubps_avx(auVar32,auVar31);
        auVar28 = vsubps_avx(auVar86,auVar187);
        fVar73 = *(float *)(ray + k * 4 + 0x60);
        auVar29 = vsubps_avx(auVar123,auVar189);
        auVar30 = vsubps_avx(auVar143,auVar191);
        fVar142 = auVar30._0_4_;
        fVar145 = auVar30._4_4_;
        auVar35._4_4_ = fVar145 * fVar169;
        auVar35._0_4_ = fVar142 * fVar169;
        fVar146 = auVar30._8_4_;
        auVar35._8_4_ = fVar146 * fVar169;
        fVar147 = auVar30._12_4_;
        auVar35._12_4_ = fVar147 * fVar169;
        fVar148 = auVar30._16_4_;
        auVar35._16_4_ = fVar148 * fVar169;
        fVar149 = auVar30._20_4_;
        auVar35._20_4_ = fVar149 * fVar169;
        fVar150 = auVar30._24_4_;
        auVar35._24_4_ = fVar150 * fVar169;
        auVar35._28_4_ = uVar48;
        fVar76 = auVar29._0_4_;
        fVar104 = auVar29._4_4_;
        auVar36._4_4_ = fVar73 * fVar104;
        auVar36._0_4_ = fVar73 * fVar76;
        fVar116 = auVar29._8_4_;
        auVar36._8_4_ = fVar73 * fVar116;
        fVar6 = auVar29._12_4_;
        auVar36._12_4_ = fVar73 * fVar6;
        fVar12 = auVar29._16_4_;
        auVar36._16_4_ = fVar73 * fVar12;
        fVar18 = auVar29._20_4_;
        auVar36._20_4_ = fVar73 * fVar18;
        fVar24 = auVar29._24_4_;
        auVar36._24_4_ = fVar73 * fVar24;
        auVar36._28_4_ = uVar51;
        auVar30 = vsubps_avx(auVar36,auVar35);
        fVar74 = *(float *)(ray + k * 4 + 0x40);
        fVar78 = auVar28._0_4_;
        fVar105 = auVar28._4_4_;
        auVar37._4_4_ = fVar73 * fVar105;
        auVar37._0_4_ = fVar73 * fVar78;
        fVar117 = auVar28._8_4_;
        auVar37._8_4_ = fVar73 * fVar117;
        fVar7 = auVar28._12_4_;
        auVar37._12_4_ = fVar73 * fVar7;
        fVar13 = auVar28._16_4_;
        auVar37._16_4_ = fVar73 * fVar13;
        fVar19 = auVar28._20_4_;
        auVar37._20_4_ = fVar73 * fVar19;
        fVar25 = auVar28._24_4_;
        auVar37._24_4_ = fVar73 * fVar25;
        auVar37._28_4_ = uVar2;
        auVar38._4_4_ = fVar145 * fVar74;
        auVar38._0_4_ = fVar142 * fVar74;
        auVar38._8_4_ = fVar146 * fVar74;
        auVar38._12_4_ = fVar147 * fVar74;
        auVar38._16_4_ = fVar148 * fVar74;
        auVar38._20_4_ = fVar149 * fVar74;
        auVar38._24_4_ = fVar150 * fVar74;
        auVar38._28_4_ = uVar33;
        auVar31 = vsubps_avx(auVar38,auVar37);
        auVar39._4_4_ = fVar74 * fVar104;
        auVar39._0_4_ = fVar74 * fVar76;
        auVar39._8_4_ = fVar74 * fVar116;
        auVar39._12_4_ = fVar74 * fVar6;
        auVar39._16_4_ = fVar74 * fVar12;
        auVar39._20_4_ = fVar74 * fVar18;
        auVar39._24_4_ = fVar74 * fVar24;
        auVar39._28_4_ = uVar2;
        auVar40._4_4_ = fVar105 * fVar169;
        auVar40._0_4_ = fVar78 * fVar169;
        auVar40._8_4_ = fVar117 * fVar169;
        auVar40._12_4_ = fVar7 * fVar169;
        auVar40._16_4_ = fVar13 * fVar169;
        auVar40._20_4_ = fVar19 * fVar169;
        auVar40._24_4_ = fVar25 * fVar169;
        auVar40._28_4_ = uVar34;
        auVar32 = vsubps_avx(auVar40,auVar39);
        fVar87 = local_a80._0_4_;
        fVar106 = local_a80._4_4_;
        fVar118 = local_a80._8_4_;
        fVar8 = local_a80._12_4_;
        fVar14 = local_a80._16_4_;
        fVar20 = local_a80._20_4_;
        fVar26 = local_a80._24_4_;
        fVar131 = auVar70._0_4_;
        fVar135 = auVar70._4_4_;
        fVar136 = auVar70._8_4_;
        fVar137 = auVar70._12_4_;
        fVar138 = auVar70._16_4_;
        fVar139 = auVar70._20_4_;
        fVar140 = auVar70._24_4_;
        fVar190 = auVar27._0_4_;
        fVar192 = auVar27._4_4_;
        fVar193 = auVar27._8_4_;
        fVar194 = auVar27._12_4_;
        fVar195 = auVar27._16_4_;
        fVar196 = auVar27._20_4_;
        fVar197 = auVar27._24_4_;
        auVar98._0_4_ = fVar190 * fVar74 + fVar73 * fVar87 + fVar131 * fVar169;
        auVar98._4_4_ = fVar192 * fVar74 + fVar73 * fVar106 + fVar135 * fVar169;
        auVar98._8_4_ = fVar193 * fVar74 + fVar73 * fVar118 + fVar136 * fVar169;
        auVar98._12_4_ = fVar194 * fVar74 + fVar73 * fVar8 + fVar137 * fVar169;
        auVar98._16_4_ = fVar195 * fVar74 + fVar73 * fVar14 + fVar138 * fVar169;
        auVar98._20_4_ = fVar196 * fVar74 + fVar73 * fVar20 + fVar139 * fVar169;
        auVar98._24_4_ = fVar197 * fVar74 + fVar73 * fVar26 + fVar140 * fVar169;
        auVar98._28_4_ = fVar73 + fVar73 + fVar169;
        auVar129._8_4_ = 0x80000000;
        auVar129._0_8_ = 0x8000000080000000;
        auVar129._12_4_ = 0x80000000;
        auVar129._16_4_ = 0x80000000;
        auVar129._20_4_ = 0x80000000;
        auVar129._24_4_ = 0x80000000;
        auVar129._28_4_ = 0x80000000;
        auVar70 = vandps_avx(auVar98,auVar129);
        uVar152 = auVar70._0_4_;
        auVar133._0_4_ =
             (float)(uVar152 ^
                    (uint)(fVar151 * auVar30._0_4_ +
                          fVar178 * auVar32._0_4_ + fVar170 * auVar31._0_4_));
        uVar157 = auVar70._4_4_;
        auVar133._4_4_ =
             (float)(uVar157 ^
                    (uint)(fVar156 * auVar30._4_4_ +
                          fVar180 * auVar32._4_4_ + fVar172 * auVar31._4_4_));
        uVar159 = auVar70._8_4_;
        auVar133._8_4_ =
             (float)(uVar159 ^
                    (uint)(fVar158 * auVar30._8_4_ +
                          fVar181 * auVar32._8_4_ + fVar173 * auVar31._8_4_));
        uVar161 = auVar70._12_4_;
        auVar133._12_4_ =
             (float)(uVar161 ^
                    (uint)(fVar160 * auVar30._12_4_ +
                          fVar182 * auVar32._12_4_ + fVar174 * auVar31._12_4_));
        uVar163 = auVar70._16_4_;
        auVar133._16_4_ =
             (float)(uVar163 ^
                    (uint)(fVar162 * auVar30._16_4_ +
                          fVar183 * auVar32._16_4_ + fVar175 * auVar31._16_4_));
        uVar165 = auVar70._20_4_;
        auVar133._20_4_ =
             (float)(uVar165 ^
                    (uint)(fVar164 * auVar30._20_4_ +
                          fVar184 * auVar32._20_4_ + fVar176 * auVar31._20_4_));
        uVar167 = auVar70._24_4_;
        auVar133._24_4_ =
             (float)(uVar167 ^
                    (uint)(fVar166 * auVar30._24_4_ +
                          fVar185 * auVar32._24_4_ + fVar177 * auVar31._24_4_));
        uVar168 = auVar70._28_4_;
        auVar133._28_4_ =
             (float)(uVar168 ^ (uint)(auVar96._28_4_ + auVar97._28_4_ + auVar71._28_4_));
        auVar141._0_4_ =
             (float)(uVar152 ^
                    (uint)(auVar30._0_4_ * fVar79 + fVar77 * auVar32._0_4_ + auVar31._0_4_ * fVar75)
                    );
        auVar141._4_4_ =
             (float)(uVar157 ^
                    (uint)(auVar30._4_4_ * fVar103 +
                          fVar102 * auVar32._4_4_ + auVar31._4_4_ * fVar101));
        auVar141._8_4_ =
             (float)(uVar159 ^
                    (uint)(auVar30._8_4_ * fVar115 +
                          fVar114 * auVar32._8_4_ + auVar31._8_4_ * fVar107));
        auVar141._12_4_ =
             (float)(uVar161 ^
                    (uint)(auVar30._12_4_ * fVar72 +
                          fVar66 * auVar32._12_4_ + auVar31._12_4_ * fVar119));
        auVar141._16_4_ =
             (float)(uVar163 ^
                    (uint)(auVar30._16_4_ * fVar11 +
                          fVar10 * auVar32._16_4_ + auVar31._16_4_ * fVar9));
        auVar141._20_4_ =
             (float)(uVar165 ^
                    (uint)(auVar30._20_4_ * fVar17 +
                          fVar16 * auVar32._20_4_ + auVar31._20_4_ * fVar15));
        auVar141._24_4_ =
             (float)(uVar167 ^
                    (uint)(auVar30._24_4_ * fVar23 +
                          fVar22 * auVar32._24_4_ + auVar31._24_4_ * fVar21));
        auVar141._28_4_ =
             (float)(uVar168 ^ (uint)(local_a80._28_4_ + auVar32._28_4_ + auVar31._28_4_));
        auVar96 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar70 = vcmpps_avx(auVar133,auVar96,5);
        auVar96 = vcmpps_avx(auVar141,auVar96,5);
        auVar70 = vandps_avx(auVar70,auVar96);
        auVar71._8_4_ = 0x7fffffff;
        auVar71._0_8_ = 0x7fffffff7fffffff;
        auVar71._12_4_ = 0x7fffffff;
        auVar71._16_4_ = 0x7fffffff;
        auVar71._20_4_ = 0x7fffffff;
        auVar71._24_4_ = 0x7fffffff;
        auVar71._28_4_ = 0x7fffffff;
        local_920 = vandps_avx(auVar98,auVar71);
        auVar96 = vcmpps_avx(auVar98,ZEXT1232(ZEXT812(0)) << 0x20,4);
        auVar70 = vandps_avx(auVar70,auVar96);
        auVar99._0_4_ = auVar133._0_4_ + auVar141._0_4_;
        auVar99._4_4_ = auVar133._4_4_ + auVar141._4_4_;
        auVar99._8_4_ = auVar133._8_4_ + auVar141._8_4_;
        auVar99._12_4_ = auVar133._12_4_ + auVar141._12_4_;
        auVar99._16_4_ = auVar133._16_4_ + auVar141._16_4_;
        auVar99._20_4_ = auVar133._20_4_ + auVar141._20_4_;
        auVar99._24_4_ = auVar133._24_4_ + auVar141._24_4_;
        auVar99._28_4_ = auVar133._28_4_ + auVar141._28_4_;
        auVar96 = vcmpps_avx(auVar99,local_920,2);
        auVar71 = auVar96 & auVar70;
        if ((((((((auVar71 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar71 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar71 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar71 >> 0x7f,0) != '\0') ||
              (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar71 >> 0xbf,0) != '\0') ||
            (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar71[0x1f] < '\0') {
          auVar70 = vandps_avx(auVar70,auVar96);
          auVar67 = vpackssdw_avx(auVar70._0_16_,auVar70._16_16_);
          local_940._0_4_ =
               (float)(uVar152 ^ (uint)(fVar190 * fVar78 + fVar76 * fVar131 + fVar142 * fVar87));
          local_940._4_4_ =
               (float)(uVar157 ^ (uint)(fVar192 * fVar105 + fVar104 * fVar135 + fVar145 * fVar106));
          local_940._8_4_ =
               (float)(uVar159 ^ (uint)(fVar193 * fVar117 + fVar116 * fVar136 + fVar146 * fVar118));
          local_940._12_4_ =
               (float)(uVar161 ^ (uint)(fVar194 * fVar7 + fVar6 * fVar137 + fVar147 * fVar8));
          local_940._16_4_ =
               (float)(uVar163 ^ (uint)(fVar195 * fVar13 + fVar12 * fVar138 + fVar148 * fVar14));
          local_940._20_4_ =
               (float)(uVar165 ^ (uint)(fVar196 * fVar19 + fVar18 * fVar139 + fVar149 * fVar20));
          local_940._24_4_ =
               (float)(uVar167 ^ (uint)(fVar197 * fVar25 + fVar24 * fVar140 + fVar150 * fVar26));
          local_940._28_4_ = uVar168 ^ (uint)(auVar28._28_4_ + auVar29._28_4_ + 0.0);
          fVar169 = *(float *)(ray + k * 4 + 0x30);
          fVar73 = local_920._0_4_;
          fVar74 = local_920._4_4_;
          auVar41._4_4_ = fVar74 * fVar169;
          auVar41._0_4_ = fVar73 * fVar169;
          fVar75 = local_920._8_4_;
          auVar41._8_4_ = fVar75 * fVar169;
          fVar77 = local_920._12_4_;
          auVar41._12_4_ = fVar77 * fVar169;
          fVar79 = local_920._16_4_;
          auVar41._16_4_ = fVar79 * fVar169;
          fVar76 = local_920._20_4_;
          auVar41._20_4_ = fVar76 * fVar169;
          fVar78 = local_920._24_4_;
          auVar41._24_4_ = fVar78 * fVar169;
          auVar41._28_4_ = fVar169;
          auVar70 = vcmpps_avx(auVar41,local_940,1);
          fVar169 = *(float *)(ray + k * 4 + 0x80);
          auVar42._4_4_ = fVar169 * fVar74;
          auVar42._0_4_ = fVar169 * fVar73;
          auVar42._8_4_ = fVar169 * fVar75;
          auVar42._12_4_ = fVar169 * fVar77;
          auVar42._16_4_ = fVar169 * fVar79;
          auVar42._20_4_ = fVar169 * fVar76;
          auVar42._24_4_ = fVar169 * fVar78;
          auVar42._28_4_ = auVar29._28_4_;
          auVar96 = vcmpps_avx(local_940,auVar42,2);
          auVar70 = vandps_avx(auVar70,auVar96);
          auVar93 = vpackssdw_avx(auVar70._0_16_,auVar70._16_16_);
          auVar67 = vpand_avx(auVar93,auVar67);
          auVar93 = vpmovzxwd_avx(auVar67);
          auVar93 = vpslld_avx(auVar93,0x1f);
          auVar94 = vpsrad_avx(auVar93,0x1f);
          auVar93 = vpunpckhwd_avx(auVar67,auVar67);
          auVar93 = vpslld_avx(auVar93,0x1f);
          auVar93 = vpsrad_avx(auVar93,0x1f);
          local_8e0._16_16_ = auVar93;
          local_8e0._0_16_ = auVar94;
          if ((((((((local_8e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_8e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_8e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_8e0 >> 0x7f,0) != '\0') ||
                (local_8e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar93 >> 0x3f,0) != '\0') ||
              (local_8e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar93[0xf] < '\0') {
            auVar70 = vsubps_avx(local_920,auVar141);
            auVar70 = vblendvps_avx(auVar133,auVar70,local_9a0);
            auVar71 = vsubps_avx(local_920,auVar133);
            auVar96 = vblendvps_avx(auVar141,auVar71,local_9a0);
            uStack_844 = auVar71._28_4_;
            local_860[0] = fVar190 * (float)local_9c0._0_4_;
            local_860[1] = fVar192 * (float)local_9c0._4_4_;
            local_860[2] = fVar193 * fStack_9b8;
            local_860[3] = fVar194 * fStack_9b4;
            fStack_850 = fVar195 * fStack_9b0;
            fStack_84c = fVar196 * fStack_9ac;
            fStack_848 = fVar197 * fStack_9a8;
            local_840[0] = (float)local_9c0._0_4_ * fVar131;
            local_840[1] = (float)local_9c0._4_4_ * fVar135;
            local_840[2] = fStack_9b8 * fVar136;
            local_840[3] = fStack_9b4 * fVar137;
            fStack_830 = fStack_9b0 * fVar138;
            fStack_82c = fStack_9ac * fVar139;
            fStack_828 = fStack_9a8 * fVar140;
            uStack_824 = uStack_844;
            local_820[0] = (float)local_9c0._0_4_ * fVar87;
            local_820[1] = (float)local_9c0._4_4_ * fVar106;
            local_820[2] = fStack_9b8 * fVar118;
            local_820[3] = fStack_9b4 * fVar8;
            fStack_810 = fStack_9b0 * fVar14;
            fStack_80c = fStack_9ac * fVar20;
            fStack_808 = fStack_9a8 * fVar26;
            uStack_804 = uStack_844;
            auVar93 = vpshufd_avx(ZEXT416(uVar57),0);
            auVar93 = vpaddd_avx(auVar93,_DAT_01f76ad0);
            auVar94 = vpshufd_avx(ZEXT416(uVar58),0);
            auVar94 = vpaddd_avx(auVar94,_DAT_01f76ae0);
            auVar127._0_4_ = (float)(int)(*(ushort *)(local_be0 + 8 + lVar55) - 1);
            auVar127._4_12_ = auVar27._4_12_;
            auVar80 = vrcpss_avx(auVar127,auVar127);
            auVar153._0_4_ = (float)(int)(*(ushort *)(local_be0 + 10 + lVar55) - 1);
            auVar153._4_12_ = auVar27._4_12_;
            auVar88 = vrcpss_avx(auVar153,auVar153);
            auVar100._16_16_ = auVar93;
            auVar100._0_16_ = auVar93;
            auVar71 = vcvtdq2ps_avx(auVar100);
            auVar93 = ZEXT416((uint)(auVar80._0_4_ * (2.0 - auVar80._0_4_ * auVar127._0_4_)));
            auVar93 = vshufps_avx(auVar93,auVar93,0);
            fVar87 = (auVar70._0_4_ + fVar73 * auVar71._0_4_) * auVar93._0_4_;
            fVar101 = (auVar70._4_4_ + fVar74 * auVar71._4_4_) * auVar93._4_4_;
            local_980._4_4_ = fVar101;
            local_980._0_4_ = fVar87;
            fVar102 = (auVar70._8_4_ + fVar75 * auVar71._8_4_) * auVar93._8_4_;
            local_980._8_4_ = fVar102;
            fVar103 = (auVar70._12_4_ + fVar77 * auVar71._12_4_) * auVar93._12_4_;
            local_980._12_4_ = fVar103;
            fVar104 = (auVar70._16_4_ + fVar79 * auVar71._16_4_) * auVar93._0_4_;
            local_980._16_4_ = fVar104;
            fVar105 = (auVar70._20_4_ + fVar76 * auVar71._20_4_) * auVar93._4_4_;
            local_980._20_4_ = fVar105;
            fVar106 = (auVar70._24_4_ + fVar78 * auVar71._24_4_) * auVar93._8_4_;
            local_980._24_4_ = fVar106;
            local_980._28_4_ = auVar70._28_4_ + auVar71._28_4_;
            auVar113._16_16_ = auVar94;
            auVar113._0_16_ = auVar94;
            auVar70 = vcvtdq2ps_avx(auVar113);
            auVar93 = ZEXT416((uint)((2.0 - auVar153._0_4_ * auVar88._0_4_) * auVar88._0_4_));
            auVar93 = vshufps_avx(auVar93,auVar93,0);
            fVar107 = (fVar73 * auVar70._0_4_ + auVar96._0_4_) * auVar93._0_4_;
            fVar114 = (fVar74 * auVar70._4_4_ + auVar96._4_4_) * auVar93._4_4_;
            local_960._4_4_ = fVar114;
            local_960._0_4_ = fVar107;
            fVar115 = (fVar75 * auVar70._8_4_ + auVar96._8_4_) * auVar93._8_4_;
            local_960._8_4_ = fVar115;
            fVar116 = (fVar77 * auVar70._12_4_ + auVar96._12_4_) * auVar93._12_4_;
            local_960._12_4_ = fVar116;
            fVar117 = (fVar79 * auVar70._16_4_ + auVar96._16_4_) * auVar93._0_4_;
            local_960._16_4_ = fVar117;
            fVar118 = (fVar76 * auVar70._20_4_ + auVar96._20_4_) * auVar93._4_4_;
            local_960._20_4_ = fVar118;
            fVar119 = (fVar78 * auVar70._24_4_ + auVar96._24_4_) * auVar93._8_4_;
            local_960._24_4_ = fVar119;
            local_960._28_4_ = auVar70._28_4_ + auVar96._28_4_;
            if ((local_b00->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (local_b00->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00f22020:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                goto LAB_00f2203a;
              }
              auStack_af8 = auVar112._8_24_;
              auVar70 = vrcpps_avx(local_920);
              fVar66 = auVar70._0_4_;
              fVar72 = auVar70._4_4_;
              auVar43._4_4_ = fVar74 * fVar72;
              auVar43._0_4_ = fVar73 * fVar66;
              fVar73 = auVar70._8_4_;
              auVar43._8_4_ = fVar75 * fVar73;
              fVar74 = auVar70._12_4_;
              auVar43._12_4_ = fVar77 * fVar74;
              fVar75 = auVar70._16_4_;
              auVar43._16_4_ = fVar79 * fVar75;
              fVar77 = auVar70._20_4_;
              auVar43._20_4_ = fVar76 * fVar77;
              fVar79 = auVar70._24_4_;
              auVar43._24_4_ = fVar78 * fVar79;
              auVar43._28_4_ = local_920._28_4_;
              auVar134._8_4_ = 0x3f800000;
              auVar134._0_8_ = 0x3f8000003f800000;
              auVar134._12_4_ = 0x3f800000;
              auVar134._16_4_ = 0x3f800000;
              auVar134._20_4_ = 0x3f800000;
              auVar134._24_4_ = 0x3f800000;
              auVar134._28_4_ = 0x3f800000;
              auVar96 = vsubps_avx(auVar134,auVar43);
              fVar66 = fVar66 + fVar66 * auVar96._0_4_;
              fVar72 = fVar72 + fVar72 * auVar96._4_4_;
              fVar73 = fVar73 + fVar73 * auVar96._8_4_;
              fVar74 = fVar74 + fVar74 * auVar96._12_4_;
              fVar75 = fVar75 + fVar75 * auVar96._16_4_;
              fVar77 = fVar77 + fVar77 * auVar96._20_4_;
              fVar79 = fVar79 + fVar79 * auVar96._24_4_;
              local_880[0] = fVar66 * local_940._0_4_;
              local_880[1] = fVar72 * local_940._4_4_;
              local_880[2] = fVar73 * local_940._8_4_;
              local_880[3] = fVar74 * local_940._12_4_;
              fStack_870 = fVar75 * local_940._16_4_;
              fStack_86c = fVar77 * local_940._20_4_;
              fStack_868 = fVar79 * local_940._24_4_;
              uStack_864 = local_940._28_4_;
              local_8c0._4_4_ = fVar101 * fVar72;
              local_8c0._0_4_ = fVar87 * fVar66;
              local_8c0._8_4_ = fVar102 * fVar73;
              local_8c0._12_4_ = fVar103 * fVar74;
              local_8c0._16_4_ = fVar104 * fVar75;
              local_8c0._20_4_ = fVar105 * fVar77;
              local_8c0._24_4_ = fVar106 * fVar79;
              local_8c0._28_4_ = local_940._28_4_;
              local_8a0[0] = fVar107 * fVar66;
              local_8a0[1] = fVar114 * fVar72;
              local_8a0[2] = fVar115 * fVar73;
              local_8a0[3] = fVar116 * fVar74;
              fStack_890 = fVar117 * fVar75;
              fStack_88c = fVar118 * fVar77;
              fStack_888 = fVar119 * fVar79;
              fStack_884 = auVar70._28_4_ + auVar96._28_4_;
              auVar67 = vpsllw_avx(auVar67,0xf);
              auVar67 = vpacksswb_avx(auVar67,auVar67);
              bVar46 = SUB161(auVar67 >> 7,0) & 1 | (SUB161(auVar67 >> 0xf,0) & 1) << 1 |
                       (SUB161(auVar67 >> 0x17,0) & 1) << 2 | (SUB161(auVar67 >> 0x1f,0) & 1) << 3 |
                       (SUB161(auVar67 >> 0x27,0) & 1) << 4 | (SUB161(auVar67 >> 0x2f,0) & 1) << 5 |
                       (SUB161(auVar67 >> 0x37,0) & 1) << 6 | SUB161(auVar67 >> 0x3f,0) << 7;
              uVar56 = (ulong)bVar46;
              uVar54 = 0;
              if (uVar56 != 0) {
                for (; (bVar46 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
                }
              }
              local_b20 = vpshufd_avx(ZEXT416(*(uint *)(local_ba8 + 0x50)),0);
              auStack_b10 = auVar128._16_16_;
              local_b40 = vpshufd_avx(ZEXT416(uVar50),0);
              auStack_b30 = auVar27._16_16_;
              fStack_b9c = fVar169;
              local_ba0 = fVar169;
              fStack_b98 = fVar169;
              fStack_b94 = fVar169;
              fStack_b90 = fVar169;
              fStack_b8c = fVar169;
              fStack_b88 = fVar169;
              fStack_b84 = fVar169;
              while (pGVar44 = local_b00, uVar56 != 0) {
                local_a20 = local_8a0[uVar54 - 8];
                fVar73 = local_8a0[uVar54];
                local_a10._4_4_ = fVar73;
                local_a10._0_4_ = fVar73;
                local_a10._8_4_ = fVar73;
                local_a10._12_4_ = fVar73;
                *(float *)(ray + k * 4 + 0x80) = local_880[uVar54];
                local_b70.context = context->user;
                local_a50 = local_860[uVar54];
                fVar73 = local_840[uVar54];
                local_a40._4_4_ = fVar73;
                local_a40._0_4_ = fVar73;
                local_a40._8_4_ = fVar73;
                local_a40._12_4_ = fVar73;
                local_a30 = local_820[uVar54];
                local_a00 = local_b40._0_8_;
                uStack_9f8 = local_b40._8_8_;
                local_9f0 = local_b20;
                vcmpps_avx(ZEXT1632(local_b20),ZEXT1632(local_b20),0xf);
                uStack_9dc = (local_b70.context)->instID[0];
                local_9e0 = uStack_9dc;
                uStack_9d8 = uStack_9dc;
                uStack_9d4 = uStack_9dc;
                uStack_9d0 = (local_b70.context)->instPrimID[0];
                uStack_9cc = uStack_9d0;
                uStack_9c8 = uStack_9d0;
                uStack_9c4 = uStack_9d0;
                local_c50 = *local_c40;
                local_b70.valid = (int *)local_c50;
                local_b70.geometryUserPtr = *(void **)((long)local_b00 + 0x18);
                local_b70.hit = (RTCHitN *)&local_a50;
                local_b70.N = 4;
                local_b70.ray = (RTCRayN *)ray;
                fStack_a4c = local_a50;
                fStack_a48 = local_a50;
                fStack_a44 = local_a50;
                fStack_a2c = local_a30;
                fStack_a28 = local_a30;
                fStack_a24 = local_a30;
                fStack_a1c = local_a20;
                fStack_a18 = local_a20;
                fStack_a14 = local_a20;
                if (*(code **)((long)local_b00 + 0x48) != (code *)0x0) {
                  (**(code **)((long)local_b00 + 0x48))(&local_b70);
                  fVar169 = local_ba0;
                }
                if (local_c50 == (undefined1  [16])0x0) {
                  auVar67 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar67 = auVar67 ^ _DAT_01f46b70;
                }
                else {
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)((long)pGVar44 + 0x3e) & 0x40) != 0)))) {
                    (*p_Var5)(&local_b70);
                    fVar169 = local_ba0;
                  }
                  auVar93 = vpcmpeqd_avx(local_c50,_DAT_01f45a50);
                  auVar67 = auVar93 ^ _DAT_01f46b70;
                  auVar95._8_4_ = 0xff800000;
                  auVar95._0_8_ = 0xff800000ff800000;
                  auVar95._12_4_ = 0xff800000;
                  auVar93 = vblendvps_avx(auVar95,*(undefined1 (*) [16])(local_b70.ray + 0x80),
                                          auVar93);
                  *(undefined1 (*) [16])(local_b70.ray + 0x80) = auVar93;
                }
                auVar85._8_8_ = 0x100000001;
                auVar85._0_8_ = 0x100000001;
                if ((auVar85 & auVar67) != (undefined1  [16])0x0) goto LAB_00f22020;
                *(float *)(ray + k * 4 + 0x80) = fVar169;
                uVar56 = uVar56 ^ 1L << (uVar54 & 0x3f);
                uVar54 = 0;
                if (uVar56 != 0) {
                  for (; (uVar56 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
                  }
                }
              }
            }
          }
        }
        auVar144 = ZEXT1664(local_a90);
        auVar155 = ZEXT1664(local_aa0);
        uVar54 = local_bd8;
        uVar56 = local_bb0;
        uVar59 = local_bb8;
        uVar60 = local_bc0;
        uVar61 = local_bc8;
        uVar62 = local_bd0;
        fVar169 = local_ab0;
        fVar74 = fStack_aac;
        fVar75 = fStack_aa8;
        fVar77 = fStack_aa4;
        fVar73 = local_ac0;
        fVar79 = fStack_abc;
        fVar76 = fStack_ab8;
        fVar78 = fStack_ab4;
      }
      auVar130 = ZEXT1664(local_ad0);
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }